

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O0

string * __thiscall
flatbuffers::Namer::Variable<flatbuffers::FieldDef>
          (string *__return_storage_ptr__,Namer *this,string *p,FieldDef *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  FieldDef *local_28;
  FieldDef *s_local;
  string *p_local;
  Namer *this_local;
  
  local_28 = s;
  s_local = (FieldDef *)p;
  p_local = (string *)this;
  this_local = (Namer *)__return_storage_ptr__;
  std::operator+(&local_68,p,"_");
  std::operator+(&local_48,&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  (*this->_vptr_Namer[0x14])(__return_storage_ptr__,this,&local_48,(ulong)(this->config_).variables)
  ;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string Variable(const std::string &p, const T &s) const {
    return Format(p + "_" + s.name, config_.variables);
  }